

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O1

void __thiscall Lodtalk::StackPage::divorceAllFrames(StackPage *this)

{
  uint8_t *puVar1;
  long lVar2;
  StackPage *pSVar3;
  uint8_t *puVar4;
  StackFrame local_28;
  
  local_28.stackPointer = (this->headFrame).stackPointer;
  for (puVar1 = (this->headFrame).framePointer; local_28.framePointer = puVar1,
      puVar1 != (uint8_t *)0x0; puVar1 = *(uint8_t **)puVar1) {
    if (puVar1[-0xe] == '\0') {
      StackFrame::marryFrame(&local_28,this->context);
    }
    StackFrame::updateMarriedSpouseState(&local_28);
    local_28.stackPointer = puVar1 + ((ulong)(*(uint *)(puVar1 + -0x10) & 0xff) + 3) * 8;
  }
  if ((this->nextPage != (StackPage *)0x0) &&
     (puVar1 = this->nextPage->baseFramePointer, puVar1 != (uint8_t *)0x0)) {
    *(long *)(*(long *)((this->headFrame).framePointer + -0x18) + 0x10) =
         *(long *)(puVar1 + 8) * 2 + 1;
    puVar1 = (this->headFrame).framePointer;
    for (puVar4 = *(uint8_t **)puVar1; puVar4 != (uint8_t *)0x0; puVar4 = *(uint8_t **)puVar4) {
      lVar2 = *(long *)(puVar4 + -0x18);
      *(long *)(*(long *)(puVar1 + -0x18) + 8) = lVar2;
      *(long *)(lVar2 + 0x10) = *(long *)(puVar1 + 8) * 2 + 1;
      puVar1 = puVar4;
    }
    this->baseFramePointer = (uint8_t *)0x0;
    (this->headFrame).framePointer = (uint8_t *)0x0;
    (this->headFrame).stackPointer = (uint8_t *)0x0;
    pSVar3 = this->previousPage;
    if (pSVar3 != (StackPage *)0x0) {
      pSVar3->nextPage = this->nextPage;
    }
    if (this->nextPage != (StackPage *)0x0) {
      this->nextPage->previousPage = pSVar3;
    }
    this->previousPage = (StackPage *)0x0;
    this->nextPage = (StackPage *)0x0;
    return;
  }
  __assert_fail("nextPage && nextPage->isInUse()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,0x32,"void Lodtalk::StackPage::divorceAllFrames()");
}

Assistant:

void StackPage::divorceAllFrames()
{
    // First pass. Ensure the frames are married and that they have their context updated.
    auto currentFrame = headFrame;
    while (currentFrame.framePointer != 0)
    {
        currentFrame.ensureHasUpdatedMarriedSpouse(context);
        currentFrame = currentFrame.getPreviousFrame();
    }

    // Get the head frame pc from the next page
    assert(nextPage && nextPage->isInUse());
    {
        StackFrame nextBaseFrame(nextPage->baseFramePointer);
        auto headContext = reinterpret_cast<Context*> (headFrame.getThisContext().pointer);
        headContext->pc = Oop::encodeSmallInteger(nextBaseFrame.getReturnPointer());
    }

    // Second pass. Divorce
    auto nextFrame = headFrame;
    currentFrame = headFrame.getPreviousFrame();
    while (currentFrame.framePointer != 0)
    {
        auto currentContext = reinterpret_cast<Context*> (currentFrame.getThisContext().pointer);
        auto nextContext = reinterpret_cast<Context*> (nextFrame.getThisContext().pointer);
        nextContext->sender = Oop::fromPointer(currentContext);
        currentContext->pc = Oop::encodeSmallInteger(nextFrame.getReturnPointer());

        nextFrame = currentFrame;
        currentFrame = currentFrame.getPreviousFrame();
    }

    freed();
}